

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void do_createcosmetic(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  char *pcVar8;
  double dVar9;
  char wlname [4608];
  char arg2 [4608];
  char arg1 [4608];
  char acStack_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  if (*argument == '\0') {
    send_to_char("createcosmetic \'wear location\' <name>\n\r",ch);
    send_to_char("createcosmetic under <eq location> \'wear location\' <name>\n\r",ch);
    send_to_char("createcosmetic eqlocations\n\r",ch);
    send_to_char("createcosmetic wear <eq location> <name>\n\r\n\r",ch);
    send_to_char("Example 1: createcosmetic \'on earlobe\' a jewel-encrusted earring\n\rwould produce \'a jewel-encrusted earring\' that\'s <worn on earlobe>\n\r"
                 ,ch);
    send_to_char("Example 2: createcosmetic under arms \'as undershirt\' a plain white t-shirt\n\rwould produce \'a plain white t-shirt\' that\'s <worn as undershirt> and visible only when arms are not covered.\n\r"
                 ,ch);
    send_to_char("Example 3: createcosmetic eqlocations will show all valid values for <eq location>\n\r"
                 ,ch);
    return;
  }
  pcVar7 = one_argument(argument,local_1238);
  bVar3 = str_cmp(local_1238,"eqlocations");
  if (!bVar3) {
    show_flag_cmds(ch,wear_flags);
    return;
  }
  bVar3 = str_cmp(local_1238,"under");
  if (bVar3) {
    bVar4 = str_cmp(local_1238,"wear");
    if (bVar4) {
      strcpy(acStack_3638,local_1238);
      bVar5 = str_cmp(pcVar7,"");
      iVar6 = 0;
      bVar4 = false;
      if (!bVar5) {
        return;
      }
    }
    else {
      pcVar7 = one_argument(pcVar7,local_2438);
      bVar4 = str_cmp(local_2438,"");
      if (((!bVar4) || (bVar4 = str_cmp(pcVar7,""), !bVar4)) ||
         (iVar6 = flag_value(wear_flags,local_2438), iVar6 == -99)) goto LAB_002d5788;
      bVar4 = true;
    }
  }
  else {
    pcVar7 = one_argument(pcVar7,local_2438);
    pcVar7 = one_argument(pcVar7,acStack_3638);
    bVar4 = str_cmp(local_2438,"");
    if ((((!bVar4) || (bVar4 = str_cmp(acStack_3638,""), !bVar4)) ||
        (bVar4 = str_cmp(pcVar7,""), !bVar4)) ||
       (iVar6 = flag_value(wear_flags,local_2438), iVar6 == -99)) {
LAB_002d5788:
      send_to_char("Invalid arguments.\n\r",ch);
      return;
    }
    bVar4 = false;
  }
  pObjIndex = get_obj_index(0);
  obj = create_object(pObjIndex,0);
  if (bVar3) {
    if (!bVar4) goto LAB_002d57e8;
    iVar2 = iVar6 + 0x1f;
    if (-1 < iVar6) {
      iVar2 = iVar6;
    }
    dVar9 = ldexp(1.0,iVar6 % 0x20);
    obj->wear_flags[iVar2 >> 5] = obj->wear_flags[iVar2 >> 5] | (long)dVar9;
  }
  else {
    pbVar1 = (byte *)((long)obj->extra_flags + 2);
    *pbVar1 = *pbVar1 | 0x20;
    iVar2 = iVar6 + 0x1f;
    if (-1 < iVar6) {
      iVar2 = iVar6;
    }
    dVar9 = ldexp(1.0,iVar6 % 0x20);
    obj->wear_flags[iVar2 >> 5] = obj->wear_flags[iVar2 >> 5] | (long)dVar9;
    if (!bVar4) goto LAB_002d57e8;
  }
  pbVar1 = (byte *)((long)obj->wear_flags + 2);
  *pbVar1 = *pbVar1 & 0xfb;
LAB_002d57e8:
  free_pstring(obj->name);
  pcVar8 = palloc_string(pcVar7);
  obj->name = pcVar8;
  free_pstring(obj->short_descr);
  pcVar7 = palloc_string(pcVar7);
  obj->short_descr = pcVar7;
  obj_to_char(obj,ch);
  if (!bVar4) {
    if (obj->wear_loc_name != (char *)0x0) {
      free_pstring(obj->wear_loc_name);
    }
    pcVar7 = palloc_string(acStack_3638);
    obj->wear_loc_name = pcVar7;
  }
  act("You create $p.",ch,obj,(void *)0x0,3);
  return;
}

Assistant:

void do_createcosmetic(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], wlname[MSL], *wearname;
	OBJ_DATA *obj;
	int value = 0;
	bool under= false, wear= false;

	if (!strcmp(argument, ""))
	{
		send_to_char("createcosmetic 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic under <eq location> 'wear location' <name>\n\r", ch);
		send_to_char("createcosmetic eqlocations\n\r", ch);
		send_to_char("createcosmetic wear <eq location> <name>\n\r\n\r", ch);
		send_to_char("Example 1: createcosmetic 'on earlobe' a jewel-encrusted earring\n\rwould produce 'a "\
					 "jewel-encrusted earring' that's <worn on earlobe>\n\r", ch);
		send_to_char("Example 2: createcosmetic under arms 'as undershirt' a plain white t-shirt\n\rwould produce 'a "\
					 "plain white t-shirt' that's <worn as undershirt> and visible only when arms are not covered.\n\r", ch);
		send_to_char("Example 3: createcosmetic eqlocations will show all valid values for <eq location>\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	if (!str_cmp(arg1, "eqlocations"))
	{
		show_flag_cmds(ch, wear_flags);
		return;
	}
	else if (!str_cmp(arg1, "under"))
	{
		argument = one_argument(argument, arg2);
		argument = one_argument(argument, wlname);
		if (!str_cmp(arg2, "")
			|| !str_cmp(wlname, "")
			|| !str_cmp(argument, "")
			||  (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		under = true;
	}
	else if (!str_cmp(arg1, "wear"))
	{
		argument = one_argument(argument, arg2);
		if (!str_cmp(arg2, "")
			|| !str_cmp(argument, "")
			|| (value = flag_value(wear_flags, arg2)) == NO_FLAG)
		{
			send_to_char("Invalid arguments.\n\r", ch);
			return;
		}

		wear = true;
	}
	else if (!wear && !under)
	{
		strcpy(&wlname[0], &arg1[0]);

		if (!str_cmp(argument, ""))
			return;
	}
	else
	{
		return;
	}

	obj = create_object(get_obj_index(40), 0);

	if (under)
		SET_BIT(obj->extra_flags, ITEM_UNDER_CLOTHES);

	if (under || wear)
		SET_BIT(obj->wear_flags, value);

	if (wear)
		REMOVE_BIT(obj->wear_flags, ITEM_WEAR_COSMETIC);

	free_pstring(obj->name);
	obj->name = palloc_string(argument);

	free_pstring(obj->short_descr);
	obj->short_descr = palloc_string(argument);

	obj_to_char(obj, ch);

	if (!wear)
	{
		if (obj->wear_loc_name)
			free_pstring(obj->wear_loc_name);

		obj->wear_loc_name = palloc_string(wlname);
	}

	act("You create $p.", ch, obj, 0, TO_CHAR);
}